

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::BooleanColumnWriter::WriteVector
          (BooleanColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  byte *pbVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  byte bVar4;
  bool bVar5;
  undefined8 in_RAX;
  char cVar6;
  idx_t r;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  FlatVector::VerifyFlatVector(input_column);
  pdVar3 = input_column->data;
  if (((*(char *)((long)&stats_p[1]._vptr_ColumnWriterStatistics + 1) == '\x01') &&
      (*(char *)&stats_p[1]._vptr_ColumnWriterStatistics == '\0')) &&
     ((input_column->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0)) {
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      bVar2 = *(byte *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1);
      bVar4 = pdVar3[chunk_start] << (bVar2 & 0x1f) |
              *(byte *)&state_p[1]._vptr_ColumnWriterPageState;
      *(byte *)&state_p[1]._vptr_ColumnWriterPageState = bVar4;
      cVar6 = bVar2 + 1;
      *(char *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1) = cVar6;
      if (cVar6 == '\b') {
        uStack_38._0_7_ = CONCAT16(bVar4,(undefined6)uStack_38);
        (**temp_writer->_vptr_WriteStream)(temp_writer,(long)&uStack_38 + 6,1);
        *(undefined2 *)&state_p[1]._vptr_ColumnWriterPageState = 0;
      }
    }
  }
  else {
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(input_column->validity).super_TemplatedValidityMask<unsigned_long>,
                         chunk_start);
      if (bVar5) {
        pbVar1 = (byte *)((long)&stats_p[1]._vptr_ColumnWriterStatistics + 1);
        *pbVar1 = *pbVar1 | pdVar3[chunk_start];
        *(byte *)&stats_p[1]._vptr_ColumnWriterStatistics =
             *(byte *)&stats_p[1]._vptr_ColumnWriterStatistics & pdVar3[chunk_start];
        bVar2 = *(byte *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1);
        bVar4 = pdVar3[chunk_start] << (bVar2 & 0x1f) |
                *(byte *)&state_p[1]._vptr_ColumnWriterPageState;
        *(byte *)&state_p[1]._vptr_ColumnWriterPageState = bVar4;
        cVar6 = bVar2 + 1;
        *(char *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1) = cVar6;
        if (cVar6 == '\b') {
          uStack_38 = CONCAT17(bVar4,(undefined7)uStack_38);
          (**temp_writer->_vptr_WriteStream)(temp_writer,(long)&uStack_38 + 7,1);
          *(undefined2 *)&state_p[1]._vptr_ColumnWriterPageState = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void BooleanColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                      ColumnWriterPageState *state_p, Vector &input_column, idx_t chunk_start,
                                      idx_t chunk_end) {
	auto &stats = stats_p->Cast<BooleanStatisticsState>();
	auto &state = state_p->Cast<BooleanWriterPageState>();
	const auto &mask = FlatVector::Validity(input_column);

	const auto *const ptr = FlatVector::GetData<bool>(input_column);
	if (stats.max && !stats.min && mask.AllValid()) {
		// Fast path: stats have already been set, and there's no NULLs
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			const auto &val = ptr[r];
			state.byte |= val << state.byte_pos;
			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	} else {
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			if (!mask.RowIsValid(r)) {
				continue;
			}
			const auto &val = ptr[r];

			stats.max |= val;
			stats.min &= val;
			state.byte |= val << state.byte_pos;

			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	}
}